

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeSSA.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_111::TypeSSA::run(TypeSSA *this,Module *module_)

{
  TypeBuilder *this_00;
  __index_type *__dest;
  __node_base_ptr *this_01;
  pointer *ppHVar1;
  __node_base_ptr *pp_Var2;
  _Hash_node_base *p_Var3;
  pointer puVar4;
  Global *pGVar5;
  pointer puVar6;
  ElementSegment *pEVar7;
  pointer ppEVar8;
  long *plVar9;
  pointer puVar10;
  Function *pFVar11;
  Module *pMVar12;
  char *pcVar13;
  long lVar14;
  char cVar15;
  bool bVar16;
  char cVar17;
  mapped_type *news;
  Struct *struct_;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  const_iterator cVar18;
  const_iterator cVar19;
  mapped_type *pmVar20;
  long *plVar21;
  undefined8 *puVar22;
  undefined1 reuse;
  uint uVar23;
  __node_base_ptr p_Var24;
  size_type *psVar25;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer ppEVar26;
  pointer puVar27;
  undefined1 auVar28 [8];
  _Hash_node_base *p_Var29;
  ulong uVar30;
  size_t n;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_1;
  pointer puVar31;
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  *this_02;
  size_t i;
  uint __val;
  Type *this_03;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar32;
  Name root;
  string_view sVar33;
  undefined1 auStack_478 [8];
  NewFinder moduleFinder;
  undefined1 local_380 [8];
  ParallelFunctionAnalysis<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  undefined1 local_338 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  existingTypeNames;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  typesSet;
  HeapType newType;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_2b8 [6];
  undefined1 local_138 [8];
  BuildResult result;
  key_type local_f0;
  value_type newType_1;
  undefined1 local_e0 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> typesVec;
  Name newName;
  undefined1 local_a8 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> newTypes;
  HeapType oldType_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> intendedName;
  string __str;
  TypeBuilder builder;
  
  this->module = module_;
  if (((module_->features).features & 0x400) != 0) {
    result.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index =
         '\0';
    result.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._25_7_ = 0;
    wasm::ModuleUtils::
    ParallelFunctionAnalysis<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
    ::ParallelFunctionAnalysis
              ((ParallelFunctionAnalysis<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                *)local_380,module_,
               (Func *)&result.
                        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                        .
                        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                        .
                        super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                        .
                        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                        .
                        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                        .
                        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                        .
                        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                        ._M_index);
    __dest = &result.
              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .
              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              _M_index;
    std::
    _Function_handler<void_(wasm::Function_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/TypeSSA.cpp:90:16)>
    ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
    auStack_478 = (undefined1  [8])0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .replacep = (Expression **)0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .stack.fixed._M_elems[9].currp = (Expression **)0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .currModule = (Module *)0x0;
    moduleFinder.news.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    moduleFinder.news.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    newType_1.id = (uintptr_t)this->module;
    puVar32 = (((Module *)newType_1.id)->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (((Module *)newType_1.id)->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .currFunction = (Function *)newType_1.id;
    if (puVar32 != puVar4) {
      do {
        pGVar5 = (puVar32->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if ((pGVar5->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
          Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
          ::walk((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                  *)auStack_478,&pGVar5->init);
        }
        puVar32 = puVar32 + 1;
      } while (puVar32 != puVar4);
    }
    puVar31 = (((Module *)newType_1.id)->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (((Module *)newType_1.id)->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar31 != puVar6) {
      do {
        pEVar7 = (puVar31->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if (pEVar7->offset != (Expression *)0x0) {
          Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
          ::walk((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                  *)auStack_478,&pEVar7->offset);
        }
        pEVar7 = (puVar31->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        ppEVar8 = (pEVar7->data).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppEVar26 = *(pointer *)
                         &(pEVar7->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl; ppEVar26 != ppEVar8; ppEVar26 = ppEVar26 + 1) {
          typesSet._M_h._M_single_bucket = (__node_base_ptr)*ppEVar26;
          Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
          ::walk((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                  *)auStack_478,(Expression **)&typesSet._M_h._M_single_bucket);
        }
        puVar31 = puVar31 + 1;
      } while (puVar31 != puVar6);
    }
    plVar21 = *(long **)(newType_1.id + 0x90);
    plVar9 = *(long **)(newType_1.id + 0x98);
    if (plVar21 != plVar9) {
      do {
        if (*(long *)(*plVar21 + 0x30) != 0) {
          Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
          ::walk((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                  *)auStack_478,(Expression **)(*plVar21 + 0x30));
        }
        plVar21 = plVar21 + 1;
      } while (plVar21 != plVar9);
    }
    moduleFinder.
    super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    .currFunction = (Function *)0x0;
    puVar27 = (this->module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar10 = (this->module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar27 != puVar10) {
      do {
        pFVar11 = (puVar27->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if ((pFVar11->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
          typesSet._M_h._M_single_bucket = (__node_base_ptr)pFVar11;
          news = std::
                 map<wasm::Function_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                 ::operator[]((map<wasm::Function_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                               *)&analysis,(key_type *)&typesSet._M_h._M_single_bucket);
          processNews(this,news);
        }
        puVar27 = puVar27 + 1;
      } while (puVar27 != puVar10);
    }
    processNews(this,(News *)&moduleFinder.
                              super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                              .
                              super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                              .currModule);
    ppEVar26 = (this->newsToModify).
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    ppEVar8 = (this->newsToModify).
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppEVar26 != ppEVar8) {
      n = (long)ppEVar26 - (long)ppEVar8 >> 3;
      TypeBuilder::TypeBuilder((TypeBuilder *)((long)&__str.field_2 + 8),n);
      this_01 = &existingTypeNames._M_h._M_single_bucket;
      this_00 = (TypeBuilder *)(&__str.field_2._M_allocated_capacity + 1);
      i = 0;
      uVar30 = 1;
      do {
        existingTypeNames._M_h._M_single_bucket =
             (__node_base_ptr)
             wasm::Type::getHeapType
                       (&(this->newsToModify).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[i]->type);
        bVar16 = HeapType::isStruct((HeapType *)this_01);
        if (bVar16) {
          struct_ = HeapType::getStruct((HeapType *)this_01);
          TypeBuilder::setHeapType(this_00,i,struct_);
        }
        else {
          HeapType::getArray((HeapType *)
                             &analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
          typesSet._M_h._M_single_bucket =
               (__node_base_ptr)analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count;
          TypeBuilder::setHeapType(this_00,i,(Array *)&typesSet._M_h._M_single_bucket);
        }
        TypeBuilder::setSubType(this_00,i,(HeapType)existingTypeNames._M_h._M_single_bucket);
        bVar16 = uVar30 < n;
        i = uVar30;
        uVar30 = (ulong)((int)uVar30 + 1);
      } while (bVar16);
      TypeBuilder::createRecGroup((TypeBuilder *)((long)&__str.field_2 + 8),0,n);
      TypeBuilder::build((BuildResult *)local_138,(TypeBuilder *)((long)&__str.field_2 + 8));
      if (result.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
          _M_first._M_storage._M_storage[0x10] == '\x01') {
        __assert_fail("!result.getError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/TypeSSA.cpp"
                      ,0xa2,"void wasm::(anonymous namespace)::TypeSSA::modifyNews()");
      }
      __x = std::
            get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                      ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                        *)local_138);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_a8,__x);
      if ((long)newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                .super__Vector_impl_data._M_start - (long)local_a8 != (long)ppEVar26 - (long)ppEVar8
         ) {
        __assert_fail("newTypes.size() == num",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/TypeSSA.cpp"
                      ,0xa4,"void wasm::(anonymous namespace)::TypeSSA::modifyNews()");
      }
      wasm::ModuleUtils::collectHeapTypes
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_e0,this->module);
      std::
      _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&existingTypeNames._M_h._M_single_bucket,local_e0,
                 typesVec.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_start,0,&typesSet._M_h._M_single_bucket,
                 local_338,&oldType_1);
      cVar18 = std::
               _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)&existingTypeNames._M_h._M_single_bucket,(key_type *)local_a8);
      if (cVar18.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0) {
        Fatal::Fatal((Fatal *)&typesSet._M_h._M_single_bucket);
        Fatal::operator<<((Fatal *)&typesSet._M_h._M_single_bucket,
                          (char (*) [50])"Rec group collision in TypeSSA! Please file a bug");
        Fatal::~Fatal((Fatal *)&typesSet._M_h._M_single_bucket);
      }
      if (local_a8 !=
          (undefined1  [8])
          newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start) {
        auVar28 = local_a8;
        do {
          typesSet._M_h._M_single_bucket = (__node_base_ptr)((key_type *)auVar28)->id;
          cVar18 = std::
                   _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)&existingTypeNames._M_h._M_single_bucket,
                          (key_type *)&typesSet._M_h._M_single_bucket);
          if (cVar18.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0) {
            __assert_fail("!typesSet.count(newType)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/TypeSSA.cpp"
                          ,0xb8,"void wasm::(anonymous namespace)::TypeSSA::modifyNews()");
          }
          auVar28 = (undefined1  [8])((long)auVar28 + 8);
        } while (auVar28 !=
                 (undefined1  [8])
                 newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      }
      local_338 = (undefined1  [8])&existingTypeNames._M_h._M_rehash_policy._M_next_resize;
      existingTypeNames._M_h._M_buckets = (__buckets_ptr)0x1;
      existingTypeNames._M_h._M_bucket_count = 0;
      existingTypeNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      existingTypeNames._M_h._M_element_count._0_4_ = 0x3f800000;
      existingTypeNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      existingTypeNames._M_h._M_rehash_policy._4_4_ = 0;
      existingTypeNames._M_h._M_rehash_policy._M_next_resize = 0;
      pMVar12 = this->module;
      p_Var29 = (pMVar12->typeNames)._M_h._M_before_begin._M_nxt;
      if (p_Var29 != (_Hash_node_base *)0x0) {
        do {
          typesSet._M_h._M_single_bucket = (__node_base_ptr)local_338;
          std::
          _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                    ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)typesSet._M_h._M_single_bucket,p_Var29 + 2,&typesSet._M_h._M_single_bucket);
          p_Var29 = p_Var29->_M_nxt;
        } while (p_Var29 != (_Hash_node_base *)0x0);
      }
      this_02 = &pMVar12->typeNames;
      ppHVar1 = &typesVec.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      uVar30 = 0;
      do {
        this_03 = &(this->newsToModify).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar30]->type;
        newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)wasm::Type::getHeapType(this_03);
        local_f0.id = ((key_type *)((long)local_a8 + uVar30 * 8))->id;
        wasm::Type::Type((Type *)&typesSet._M_h._M_single_bucket,(HeapType)local_f0.id,NonNullable);
        this_03->id = (uintptr_t)typesSet._M_h._M_single_bucket;
        cVar19 = std::
                 _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_02->_M_h,
                        (key_type *)
                        &newTypes.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage);
        if (cVar19.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
            ._M_cur != (__node_type *)0x0) {
          pmVar20 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_02,
                                 (key_type *)
                                 &newTypes.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pcVar13 = (pmVar20->name).super_IString.str._M_str;
          typesVec.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)&newName.super_IString.str._M_str;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)ppHVar1,pcVar13,pcVar13 + (pmVar20->name).super_IString.str._M_len);
          plVar21 = (long *)std::__cxx11::string::_M_replace_aux
                                      ((ulong)ppHVar1,newName.super_IString.str._M_len,0,'\x01');
          typesSet._M_h._M_single_bucket = (__node_base_ptr)local_2b8;
          p_Var24 = (__node_base_ptr)(plVar21 + 2);
          if ((__node_base_ptr)*plVar21 == p_Var24) {
            local_2b8[0]._M_buckets = &p_Var24->_M_nxt->_M_nxt;
            local_2b8[0]._M_bucket_count = plVar21[3];
          }
          else {
            local_2b8[0]._M_buckets = &p_Var24->_M_nxt->_M_nxt;
            typesSet._M_h._M_single_bucket = (__node_base_ptr)*plVar21;
          }
          lVar14 = plVar21[1];
          *plVar21 = (long)p_Var24;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          __val = this->nameCounter + 1;
          this->nameCounter = __val;
          cVar17 = '\x01';
          if (9 < __val) {
            uVar23 = __val;
            cVar15 = '\x04';
            do {
              cVar17 = cVar15;
              if (uVar23 < 100) {
                cVar17 = cVar17 + -2;
                goto LAB_008d6ef7;
              }
              if (uVar23 < 1000) {
                cVar17 = cVar17 + -1;
                goto LAB_008d6ef7;
              }
              if (uVar23 < 10000) goto LAB_008d6ef7;
              bVar16 = 99999 < uVar23;
              uVar23 = uVar23 / 10000;
              cVar15 = cVar17 + '\x04';
            } while (bVar16);
            cVar17 = cVar17 + '\x01';
          }
LAB_008d6ef7:
          intendedName.field_2._8_8_ = &__str._M_string_length;
          std::__cxx11::string::_M_construct((ulong)((long)&intendedName.field_2 + 8),cVar17);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)intendedName.field_2._8_8_,(uint)__str._M_dataplus._M_p,__val);
          p_Var29 = (_Hash_node_base *)0xf;
          if ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)typesSet._M_h._M_single_bucket != local_2b8) {
            p_Var29 = (_Hash_node_base *)local_2b8[0]._M_buckets;
          }
          p_Var3 = (_Hash_node_base *)
                   (CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p) + lVar14);
          if (p_Var29 < p_Var3) {
            p_Var29 = (_Hash_node_base *)0xf;
            if ((size_type *)intendedName.field_2._8_8_ != &__str._M_string_length) {
              p_Var29 = (_Hash_node_base *)__str._M_string_length;
            }
            if (p_Var29 < p_Var3) goto LAB_008d6f66;
            puVar22 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)((long)&intendedName.field_2 + 8),0,(char *)0x0,
                                 (ulong)typesSet._M_h._M_single_bucket);
          }
          else {
LAB_008d6f66:
            puVar22 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&typesSet._M_h._M_single_bucket,intendedName.field_2._8_8_)
            ;
          }
          psVar25 = puVar22 + 2;
          if ((size_type *)*puVar22 == psVar25) {
            intendedName._M_string_length = *psVar25;
            intendedName.field_2._M_allocated_capacity = puVar22[3];
            oldType_1.id = (uintptr_t)&intendedName._M_string_length;
          }
          else {
            intendedName._M_string_length = *psVar25;
            oldType_1.id = (uintptr_t)*puVar22;
          }
          intendedName._M_dataplus._M_p = (pointer)puVar22[1];
          *puVar22 = psVar25;
          puVar22[1] = 0;
          *(undefined1 *)psVar25 = 0;
          if ((size_type *)intendedName.field_2._8_8_ != &__str._M_string_length) {
            operator_delete((void *)intendedName.field_2._8_8_,__str._M_string_length + 1);
          }
          reuse = SUB81(psVar25,0);
          if ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)typesSet._M_h._M_single_bucket != local_2b8) {
            operator_delete(typesSet._M_h._M_single_bucket,
                            (ulong)((long)local_2b8[0]._M_buckets + 1));
          }
          if (typesVec.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage !=
              (pointer)&newName.super_IString.str._M_str) {
            operator_delete(typesVec.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (ulong)(newName.super_IString.str._M_str + 1));
          }
          sVar33._M_str = (char *)0x0;
          sVar33._M_len = oldType_1.id;
          sVar33 = IString::interned((IString *)intendedName._M_dataplus._M_p,sVar33,(bool)reuse);
          typesSet._M_h._M_single_bucket = (__node_base_ptr)local_338;
          local_2b8[0]._M_bucket_count =
               (size_type)
               std::
               _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:102:23)>
               ::_M_invoke;
          local_2b8[0]._M_buckets =
               (__buckets_ptr)
               std::
               _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:102:23)>
               ::_M_manager;
          root.super_IString.str._M_str = (char *)&typesSet._M_h._M_single_bucket;
          root.super_IString.str._M_len = (size_t)sVar33._M_str;
          sVar33 = (string_view)
                   Names::getValidName((Names *)sVar33._M_len,root,
                                       (function<bool_(wasm::Name)> *)
                                       std::
                                       _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:102:23)>
                                       ::_M_manager);
          if (local_2b8[0]._M_buckets != (__buckets_ptr)0x0) {
            pp_Var2 = &typesSet._M_h._M_single_bucket;
            (*(code *)local_2b8[0]._M_buckets)(pp_Var2,pp_Var2,3);
          }
          unique0x10001c06 = sVar33;
          pmVar20 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_02,
                                 (key_type *)
                                 &newTypes.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          typesSet._M_h._M_single_bucket = (__node_base_ptr)(pmVar20->name).super_IString.str._M_len
          ;
          local_2b8[0]._M_buckets = (__buckets_ptr)0x0;
          local_2b8[0]._M_bucket_count = (pmVar20->fieldNames)._M_h._M_bucket_count;
          local_2b8[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_2b8[0]._M_element_count = (pmVar20->fieldNames)._M_h._M_element_count;
          local_2b8[0]._M_rehash_policy._M_max_load_factor =
               (pmVar20->fieldNames)._M_h._M_rehash_policy._M_max_load_factor;
          local_2b8[0]._M_rehash_policy._4_4_ =
               *(undefined4 *)&(pmVar20->fieldNames)._M_h._M_rehash_policy.field_0x4;
          local_2b8[0]._M_rehash_policy._M_next_resize =
               (pmVar20->fieldNames)._M_h._M_rehash_policy._M_next_resize;
          intendedName.field_2._8_8_ = local_2b8;
          local_2b8[0]._M_single_bucket = (__node_base_ptr)0x0;
          std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,wasm::Name>,false>>>>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)intendedName.field_2._8_8_,&(pmVar20->fieldNames)._M_h,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_wasm::Name>,_false>_>_>
                      *)((long)&intendedName.field_2 + 8));
          sVar33 = stack0xffffffffffffff38;
          typesSet._M_h._M_single_bucket =
               (__node_base_ptr)
               typesVec.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          pmVar20 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_02,&local_f0);
          newType.id._0_4_ = sVar33._M_str._0_4_;
          newType.id._4_4_ = sVar33._M_str._4_4_;
          *(undefined4 *)&(pmVar20->name).super_IString.str._M_len =
               typesSet._M_h._M_single_bucket._0_4_;
          *(undefined4 *)((long)&(pmVar20->name).super_IString.str._M_len + 4) =
               typesSet._M_h._M_single_bucket._4_4_;
          *(undefined4 *)&(pmVar20->name).super_IString.str._M_str = (undefined4)newType.id;
          *(undefined4 *)((long)&(pmVar20->name).super_IString.str._M_str + 4) = newType.id._4_4_;
          if ((mapped_type *)&typesSet._M_h._M_single_bucket != pmVar20) {
            std::
            _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                      ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&pmVar20->fieldNames,local_2b8);
          }
          intendedName.field_2._8_8_ = local_338;
          std::
          _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                    ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)intendedName.field_2._8_8_,ppHVar1,
                     (undefined1 *)((long)&intendedName.field_2 + 8));
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(local_2b8);
          if ((size_type *)oldType_1.id != &intendedName._M_string_length) {
            operator_delete((void *)oldType_1.id,intendedName._M_string_length + 1);
          }
        }
        uVar30 = (ulong)((int)uVar30 + 1);
      } while (uVar30 < n);
      std::
      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_338);
      std::
      _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&existingTypeNames._M_h._M_single_bucket);
      if (local_e0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_e0,
                        (long)typesVec.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)local_e0);
      }
      if (local_a8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_a8,
                        (long)newTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)local_a8);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
        ::_S_vtable._M_arr
        [result.
         super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
         .
         super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
         .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
         super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
         super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
         super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
         super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
         _M_first._M_storage._M_storage[0x10]]._M_data)
                ((anon_class_1_0_00000001 *)&typesSet._M_h._M_single_bucket,
                 (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  *)local_138);
      TypeBuilder::~TypeBuilder((TypeBuilder *)((long)&__str.field_2 + 8));
    }
    if (moduleFinder.
        super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
        .currModule != (Module *)0x0) {
      operator_delete(moduleFinder.
                      super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                      .currModule,
                      (long)moduleFinder.news.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)moduleFinder.
                            super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                            .currModule);
    }
    if (moduleFinder.
        super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
        .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
      operator_delete(moduleFinder.
                      super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                      .stack.fixed._M_elems[9].currp,
                      (long)moduleFinder.
                            super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                            .stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)moduleFinder.
                            super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                            .stack.fixed._M_elems[9].currp);
    }
    std::
    _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                 *)&analysis);
  }
  return;
}

Assistant:

void run(Module* module_) override {
    module = module_;

    if (!module->features.hasGC()) {
      return;
    }

    // First, find all the struct/array.news.

    ModuleUtils::ParallelFunctionAnalysis<News> analysis(
      *module, [&](Function* func, News& news) {
        if (func->imported()) {
          return;
        }

        NewFinder finder;
        finder.walk(func->body);
        news = std::move(finder.news);
      });

    // Also find news in the module scope.
    NewFinder moduleFinder;
    moduleFinder.walkModuleCode(module);

    // Process all the news to find the ones we want to modify, adding them to
    // newsToModify. Note that we must do so in a deterministic order.
    ModuleUtils::iterDefinedFunctions(
      *module, [&](Function* func) { processNews(analysis.map[func]); });
    processNews(moduleFinder.news);

    // Modify the ones we found are relevant. We must modify them all at once as
    // in the isorecursive type system we want to create a single new rec group
    // for them all (see below).
    modifyNews();
  }